

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void mouse_callback(GLFWwindow *window,double xpos,double ypos)

{
  float fVar1;
  double dVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  double dVar3;
  tvec3<float,_(glm::precision)0> tVar4;
  undefined8 local_58;
  float local_50;
  undefined1 local_38 [8];
  vec3 front;
  float sensitivity;
  float yoffset;
  float xoffset;
  double ypos_local;
  double xpos_local;
  GLFWwindow *window_local;
  
  if (firstMouse) {
    lastX = (float)xpos;
    lastY = (float)ypos;
    firstMouse = false;
  }
  dVar3 = (double)lastX;
  dVar2 = (double)lastY;
  lastX = (float)xpos;
  lastY = (float)ypos;
  front.field_0.field_0.y = 0.1;
  front.field_0.field_0.z = (float)(dVar2 - ypos) * 0.1;
  yaw = (float)(xpos - dVar3) * 0.1 + yaw;
  pitch = front.field_0.field_0.z + pitch;
  if (89.0 < pitch) {
    pitch = 89.0;
  }
  if (pitch < -89.0) {
    pitch = -89.0;
  }
  glm::tvec3<float,_(glm::precision)0>::tvec3((tvec3<float,_(glm::precision)0> *)local_38);
  fVar1 = glm::radians<float>(yaw);
  dVar2 = std::cos((double)CONCAT44(extraout_XMM0_Db,fVar1));
  fVar1 = glm::radians<float>(pitch);
  dVar3 = std::cos((double)CONCAT44(extraout_XMM0_Db_00,fVar1));
  local_38._0_4_ = SUB84(dVar2,0) * SUB84(dVar3,0);
  fVar1 = glm::radians<float>(pitch);
  dVar2 = std::sin((double)CONCAT44(extraout_XMM0_Db_01,fVar1));
  local_38._4_4_ = SUB84(dVar2,0);
  fVar1 = glm::radians<float>(yaw);
  dVar2 = std::sin((double)CONCAT44(extraout_XMM0_Db_02,fVar1));
  fVar1 = glm::radians<float>(pitch);
  dVar3 = std::cos((double)CONCAT44(extraout_XMM0_Db_03,fVar1));
  front.field_0.field_0.x = SUB84(dVar2,0) * SUB84(dVar3,0);
  tVar4 = glm::normalize<float,(glm::precision)0,glm::tvec3>
                    ((tvec3<float,_(glm::precision)0> *)local_38);
  local_58 = tVar4.field_0._0_8_;
  local_50 = tVar4.field_0._8_4_;
  cameraFront.field_0._0_8_ = local_58;
  cameraFront.field_0.field_0.z = local_50;
  return;
}

Assistant:

void mouse_callback(GLFWwindow* window, double xpos, double ypos)
{
  if (firstMouse){
    lastX = xpos;
    lastY = ypos;
    firstMouse = false;
  }

  float xoffset = xpos - lastX;
  float yoffset = lastY - ypos; // reversed since y-coordinates go from bottom to top
  lastX = xpos;
  lastY = ypos;

  float sensitivity = 0.1f; // change this value to your liking
  xoffset *= sensitivity;
  yoffset *= sensitivity;

  yaw += xoffset;
  pitch += yoffset;

  // make sure that when pitch is out of bounds, screen doesn't get flipped
  if (pitch > 89.0f)
    pitch = 89.0f;
  if (pitch < -89.0f)
    pitch = -89.0f;

  glm::vec3 front;
  front.x = cos(glm::radians(yaw)) * cos(glm::radians(pitch));
  front.y = sin(glm::radians(pitch));
  front.z = sin(glm::radians(yaw)) * cos(glm::radians(pitch));
  cameraFront = glm::normalize(front);
}